

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

void ZSTD_initCCtx(ZSTD_CCtx *cctx,ZSTD_customMem memManager)

{
  uint __line;
  size_t sVar1;
  char *__assertion;
  ZSTD_cpuid_t ZVar2;
  
  if (cctx == (ZSTD_CCtx *)0x0) {
    __assertion = "cctx != NULL";
    __line = 0x67;
  }
  else {
    memset(cctx,0,0x1478);
    (cctx->customMem).customAlloc = memManager.customAlloc;
    (cctx->customMem).customFree = memManager.customFree;
    (cctx->customMem).opaque = memManager.opaque;
    ZVar2 = ZSTD_cpuid();
    cctx->bmi2 = ZVar2.f1c >> 8 & ZVar2.f1c >> 3 & 1;
    sVar1 = ZSTD_CCtx_reset(cctx,ZSTD_reset_parameters);
    if (sVar1 < 0xffffffffffffff89) {
      return;
    }
    __assertion = "!ZSTD_isError(err)";
    __line = 0x6c;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                ,__line,"void ZSTD_initCCtx(ZSTD_CCtx *, ZSTD_customMem)");
}

Assistant:

static void ZSTD_initCCtx(ZSTD_CCtx* cctx, ZSTD_customMem memManager)
{
    assert(cctx != NULL);
    ZSTD_memset(cctx, 0, sizeof(*cctx));
    cctx->customMem = memManager;
    cctx->bmi2 = ZSTD_cpuSupportsBmi2();
    {   size_t const err = ZSTD_CCtx_reset(cctx, ZSTD_reset_parameters);
        assert(!ZSTD_isError(err));
        (void)err;
    }
}